

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O0

void __thiscall irr::io::SNamedPath::setPath(SNamedPath *this,path *p)

{
  string<char> *in_stack_ffffffffffffffd0;
  string<char> *in_stack_ffffffffffffffd8;
  path *in_stack_ffffffffffffffe0;
  SNamedPath *in_stack_ffffffffffffffe8;
  
  core::string<char>::operator=(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  PathToName(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  core::string<char>::operator=(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  core::string<char>::~string((string<char> *)0x304d40);
  return;
}

Assistant:

void setPath(const path &p)
	{
		Path = p;
		InternalName = PathToName(p);
	}